

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_props.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  Prog *this;
  undefined8 uVar2;
  long in_RSI;
  int in_EDI;
  Prog prog;
  Theme theme;
  char *filename;
  ALLEGRO_DISPLAY *display;
  Prog *this_00;
  ALLEGRO_FONT *in_stack_fffffffffffffa48;
  Theme *in_stack_fffffffffffffa50;
  uint in_stack_fffffffffffffc7c;
  ALLEGRO_DISPLAY *in_stack_fffffffffffffc80;
  Theme *in_stack_fffffffffffffc88;
  Prog *in_stack_fffffffffffffc90;
  char *local_20;
  
  if (in_EDI < 2) {
    local_20 = "data/welcome.wav";
  }
  else {
    local_20 = *(char **)(in_RSI + 8);
  }
  uVar1 = al_install_system(0x5020700,atexit);
  if ((uVar1 & 1) == 0) {
    abort_example("Could not init Allegro\n");
  }
  al_install_keyboard();
  al_install_mouse();
  al_init_font_addon();
  al_init_primitives_addon();
  al_init_acodec_addon();
  init_platform_specific();
  uVar1 = al_install_audio();
  if ((uVar1 & 1) == 0) {
    abort_example("Could not init sound!\n");
  }
  uVar1 = al_reserve_samples(1);
  if ((uVar1 & 1) == 0) {
    abort_example("Could not set up voice and mixer.\n");
  }
  sample = (ALLEGRO_SAMPLE *)al_load_sample(local_20);
  if (sample == (ALLEGRO_SAMPLE *)0x0) {
    abort_example("Could not load sample from \'%s\'!\n",local_20);
  }
  al_set_new_display_flags(0x40);
  this = (Prog *)al_create_display(0x280,0x1e0);
  if (this == (Prog *)0x0) {
    abort_example("Unable to create display\n");
  }
  font_gui = (ALLEGRO_FONT *)al_create_builtin_font();
  if (font_gui == (ALLEGRO_FONT *)0x0) {
    abort_example("Failed to create builtin font\n");
  }
  sample_inst = (ALLEGRO_SAMPLE_INSTANCE *)al_create_sample_instance(sample);
  al_set_sample_instance_playmode(sample_inst,0x101);
  this_00 = (Prog *)sample_inst;
  uVar2 = al_get_default_mixer();
  al_attach_sample_instance_to_mixer(this_00,uVar2);
  al_play_sample_instance(sample_inst);
  Theme::Theme(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  al_get_sample_instance_length(sample_inst);
  Prog::Prog(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
             in_stack_fffffffffffffc7c);
  Prog::run(this);
  Prog::~Prog(this_00);
  al_destroy_sample_instance(sample_inst);
  al_destroy_sample(sample);
  al_uninstall_audio();
  al_destroy_font(font_gui);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   const char *filename;

   if (argc >= 2) {
      filename = argv[1];
   }
   else {
      filename = "data/welcome.wav";
   }

   if (!al_init()) {
      abort_example("Could not init Allegro\n");
   }
   al_install_keyboard();
   al_install_mouse();

   al_init_font_addon();
   al_init_primitives_addon();
   al_init_acodec_addon();
   init_platform_specific();

   if (!al_install_audio()) {
      abort_example("Could not init sound!\n");
   }

   if (!al_reserve_samples(1)) {
      abort_example("Could not set up voice and mixer.\n");
   }

   sample = al_load_sample(filename);
   if (!sample) {
      abort_example("Could not load sample from '%s'!\n", filename);
   }

   al_set_new_display_flags(ALLEGRO_GENERATE_EXPOSE_EVENTS);
   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Unable to create display\n");
   }

   font_gui = al_create_builtin_font();
   if (!font_gui) {
      abort_example("Failed to create builtin font\n");
   }

   /* Loop the sample. */
   sample_inst = al_create_sample_instance(sample);
   al_set_sample_instance_playmode(sample_inst, ALLEGRO_PLAYMODE_LOOP);
   al_attach_sample_instance_to_mixer(sample_inst, al_get_default_mixer());
   al_play_sample_instance(sample_inst);

   /* Don't remove these braces. */
   {
      Theme theme(font_gui);
      Prog prog(theme, display, al_get_sample_instance_length(sample_inst));
      prog.run();
   }

   al_destroy_sample_instance(sample_inst);
   al_destroy_sample(sample);
   al_uninstall_audio();

   al_destroy_font(font_gui);

   return 0;

   (void)argc;
   (void)argv;
}